

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TgExpendSymmetry(Abc_TgMan_t *pMan,char *pDest)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  
  if (pMan->nGVars < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      bVar3 = pMan->pPerm[lVar2];
      if (-1 < (char)bVar3) {
        pbVar5 = (byte *)(pDest + iVar1);
        do {
          *pbVar5 = bVar3;
          bVar3 = pMan->symLink[bVar3];
          pbVar5 = pbVar5 + 1;
          iVar1 = iVar1 + 1;
        } while (-1 < (char)bVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pMan->nGVars);
  }
  bVar3 = pMan->symLink[pMan->nVars];
  iVar4 = iVar1;
  if (-1 < (char)bVar3) {
    pbVar5 = (byte *)(pDest + iVar1);
    do {
      *pbVar5 = bVar3;
      bVar3 = pMan->symLink[bVar3];
      pbVar5 = pbVar5 + 1;
      iVar4 = iVar4 + 1;
    } while (-1 < (char)bVar3);
  }
  if (iVar4 != pMan->nVars) {
    __assert_fail("i == pMan->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x7c1,"int Abc_TgExpendSymmetry(Abc_TgMan_t *, char *)");
  }
  return iVar1;
}

Assistant:

int Abc_TgExpendSymmetry(Abc_TgMan_t * pMan, char * pDest)
{
    int i = 0, j, k, s;
    char * pPerm = pMan->pPerm;
    for (j = 0; j < pMan->nGVars; j++)
        for (k = pPerm[j]; k >= 0; k = pMan->symLink[k])
            pDest[i++] = k;
    s = i;
    for (k = pMan->symLink[pMan->nVars]; k >= 0; k = pMan->symLink[k])
        pDest[i++] = k;
    assert(i == pMan->nVars);
    return s;
}